

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void av1_iadst8_sse2(__m128i *input,__m128i *output)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined8 uVar99;
  undefined8 uVar100;
  undefined8 uVar101;
  undefined8 uVar102;
  undefined8 uVar103;
  undefined8 uVar104;
  uint uVar105;
  int iVar106;
  uint uVar107;
  int iVar108;
  uint uVar109;
  int iVar110;
  uint uVar111;
  int iVar112;
  uint uVar113;
  int iVar114;
  undefined4 uVar115;
  int iVar116;
  int32_t *piVar117;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  __m128i d1_7;
  __m128i d0_7;
  __m128i c1_7;
  __m128i c0_7;
  __m128i b1_7;
  __m128i b0_7;
  __m128i a1_7;
  __m128i a0_7;
  __m128i v1_7;
  __m128i v0_7;
  __m128i u1_7;
  __m128i u0_7;
  __m128i t1_7;
  __m128i t0_7;
  __m128i d1_6;
  __m128i d0_6;
  __m128i c1_6;
  __m128i c0_6;
  __m128i b1_6;
  __m128i b0_6;
  __m128i a1_6;
  __m128i a0_6;
  __m128i v1_6;
  __m128i v0_6;
  __m128i u1_6;
  __m128i u0_6;
  __m128i t1_6;
  __m128i t0_6;
  __m128i _in1_7;
  __m128i _in0_7;
  __m128i _in1_6;
  __m128i _in0_6;
  __m128i _in1_5;
  __m128i _in0_5;
  __m128i _in1_4;
  __m128i _in0_4;
  __m128i d1_5;
  __m128i d0_5;
  __m128i c1_5;
  __m128i c0_5;
  __m128i b1_5;
  __m128i b0_5;
  __m128i a1_5;
  __m128i a0_5;
  __m128i v1_5;
  __m128i v0_5;
  __m128i u1_5;
  __m128i u0_5;
  __m128i t1_5;
  __m128i t0_5;
  __m128i d1_4;
  __m128i d0_4;
  __m128i c1_4;
  __m128i c0_4;
  __m128i b1_4;
  __m128i b0_4;
  __m128i a1_4;
  __m128i a0_4;
  __m128i v1_4;
  __m128i v0_4;
  __m128i u1_4;
  __m128i u0_4;
  __m128i t1_4;
  __m128i t0_4;
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i d1_3;
  __m128i d0_3;
  __m128i c1_3;
  __m128i c0_3;
  __m128i b1_3;
  __m128i b0_3;
  __m128i a1_3;
  __m128i a0_3;
  __m128i v1_3;
  __m128i v0_3;
  __m128i u1_3;
  __m128i u0_3;
  __m128i t1_3;
  __m128i t0_3;
  __m128i d1_2;
  __m128i d0_2;
  __m128i c1_2;
  __m128i c0_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a1_2;
  __m128i a0_2;
  __m128i v1_2;
  __m128i v0_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i t1_2;
  __m128i t0_2;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i x [8];
  __m128i cospi_p32_m32;
  __m128i cospi_p32_p32;
  __m128i cospi_m48_p16;
  __m128i cospi_p48_m16;
  __m128i cospi_p16_p48;
  __m128i cospi_p12_m52;
  __m128i cospi_p52_p12;
  __m128i cospi_p28_m36;
  __m128i cospi_p36_p28;
  __m128i cospi_p44_m20;
  __m128i cospi_p20_p44;
  __m128i cospi_p60_m04;
  __m128i cospi_p04_p60;
  __m128i __rounding;
  __m128i __zero;
  int32_t *cospi;
  int8_t cos_bit;
  undefined8 local_1628;
  undefined8 uStack_1620;
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined2 local_1458;
  undefined2 uStack_1456;
  undefined2 uStack_1454;
  undefined2 uStack_1452;
  undefined2 local_1448;
  undefined2 uStack_1446;
  undefined2 uStack_1444;
  undefined2 uStack_1442;
  undefined2 local_1438;
  undefined2 uStack_1436;
  undefined2 uStack_1434;
  undefined2 uStack_1432;
  undefined2 local_1428;
  undefined2 uStack_1426;
  undefined2 uStack_1424;
  undefined2 uStack_1422;
  undefined2 local_1418;
  undefined2 uStack_1416;
  undefined2 uStack_1414;
  undefined2 uStack_1412;
  undefined2 local_1408;
  undefined2 uStack_1406;
  undefined2 uStack_1404;
  undefined2 uStack_1402;
  undefined2 local_13f8;
  undefined2 uStack_13f6;
  undefined2 uStack_13f4;
  undefined2 uStack_13f2;
  undefined2 local_13e8;
  undefined2 uStack_13e6;
  undefined2 uStack_13e4;
  undefined2 uStack_13e2;
  undefined2 local_13d8;
  undefined2 uStack_13d6;
  undefined2 uStack_13d4;
  undefined2 uStack_13d2;
  undefined2 local_13c8;
  undefined2 uStack_13c6;
  undefined2 uStack_13c4;
  undefined2 uStack_13c2;
  undefined2 local_13b8;
  undefined2 uStack_13b6;
  undefined2 uStack_13b4;
  undefined2 uStack_13b2;
  undefined2 local_13a8;
  undefined2 uStack_13a6;
  undefined2 uStack_13a4;
  undefined2 uStack_13a2;
  undefined2 local_1398;
  undefined2 uStack_1396;
  undefined2 uStack_1394;
  undefined2 uStack_1392;
  undefined2 local_1388;
  undefined2 uStack_1386;
  undefined2 uStack_1384;
  undefined2 uStack_1382;
  undefined2 local_1378;
  undefined2 uStack_1376;
  undefined2 uStack_1374;
  undefined2 uStack_1372;
  undefined2 local_1368;
  undefined2 uStack_1366;
  undefined2 uStack_1364;
  undefined2 uStack_1362;
  undefined2 uStack_1350;
  undefined2 uStack_134e;
  undefined2 uStack_134c;
  undefined2 uStack_134a;
  undefined2 uStack_1340;
  undefined2 uStack_133e;
  undefined2 uStack_133c;
  undefined2 uStack_133a;
  undefined2 uStack_1330;
  undefined2 uStack_132e;
  undefined2 uStack_132c;
  undefined2 uStack_132a;
  undefined2 uStack_1320;
  undefined2 uStack_131e;
  undefined2 uStack_131c;
  undefined2 uStack_131a;
  undefined2 uStack_1310;
  undefined2 uStack_130e;
  undefined2 uStack_130c;
  undefined2 uStack_130a;
  undefined2 uStack_1300;
  undefined2 uStack_12fe;
  undefined2 uStack_12fc;
  undefined2 uStack_12fa;
  undefined2 uStack_12f0;
  undefined2 uStack_12ee;
  undefined2 uStack_12ec;
  undefined2 uStack_12ea;
  undefined2 uStack_12e0;
  undefined2 uStack_12de;
  undefined2 uStack_12dc;
  undefined2 uStack_12da;
  undefined2 uStack_12d0;
  undefined2 uStack_12ce;
  undefined2 uStack_12cc;
  undefined2 uStack_12ca;
  undefined2 uStack_12c0;
  undefined2 uStack_12be;
  undefined2 uStack_12bc;
  undefined2 uStack_12ba;
  undefined2 uStack_12b0;
  undefined2 uStack_12ae;
  undefined2 uStack_12ac;
  undefined2 uStack_12aa;
  undefined2 uStack_12a0;
  undefined2 uStack_129e;
  undefined2 uStack_129c;
  undefined2 uStack_129a;
  undefined2 uStack_1290;
  undefined2 uStack_128e;
  undefined2 uStack_128c;
  undefined2 uStack_128a;
  undefined2 uStack_1280;
  undefined2 uStack_127e;
  undefined2 uStack_127c;
  undefined2 uStack_127a;
  undefined2 uStack_1270;
  undefined2 uStack_126e;
  undefined2 uStack_126c;
  undefined2 uStack_126a;
  undefined2 uStack_1260;
  undefined2 uStack_125e;
  undefined2 uStack_125c;
  undefined2 uStack_125a;
  int local_e48;
  int iStack_e44;
  int iStack_e40;
  int iStack_e3c;
  int local_e28;
  int iStack_e24;
  int iStack_e20;
  int iStack_e1c;
  int local_e08;
  int iStack_e04;
  int iStack_e00;
  int iStack_dfc;
  int local_de8;
  int iStack_de4;
  int iStack_de0;
  int iStack_ddc;
  int local_dc8;
  int iStack_dc4;
  int iStack_dc0;
  int iStack_dbc;
  int local_da8;
  int iStack_da4;
  int iStack_da0;
  int iStack_d9c;
  int local_d88;
  int iStack_d84;
  int iStack_d80;
  int iStack_d7c;
  int local_d68;
  int iStack_d64;
  int iStack_d60;
  int iStack_d5c;
  int local_d48;
  int iStack_d44;
  int iStack_d40;
  int iStack_d3c;
  int local_d28;
  int iStack_d24;
  int iStack_d20;
  int iStack_d1c;
  int local_d08;
  int iStack_d04;
  int iStack_d00;
  int iStack_cfc;
  int local_ce8;
  int iStack_ce4;
  int iStack_ce0;
  int iStack_cdc;
  int local_cc8;
  int iStack_cc4;
  int iStack_cc0;
  int iStack_cbc;
  int local_ca8;
  int iStack_ca4;
  int iStack_ca0;
  int iStack_c9c;
  int local_c88;
  int iStack_c84;
  int iStack_c80;
  int iStack_c7c;
  int local_c68;
  int iStack_c64;
  int iStack_c60;
  int iStack_c5c;
  int local_c48;
  int iStack_c44;
  int iStack_c40;
  int iStack_c3c;
  int local_c28;
  int iStack_c24;
  int iStack_c20;
  int iStack_c1c;
  int local_c08;
  int iStack_c04;
  int iStack_c00;
  int iStack_bfc;
  int local_be8;
  int iStack_be4;
  int iStack_be0;
  int iStack_bdc;
  int local_bc8;
  int iStack_bc4;
  int iStack_bc0;
  int iStack_bbc;
  int local_ba8;
  int iStack_ba4;
  int iStack_ba0;
  int iStack_b9c;
  int local_b88;
  int iStack_b84;
  int iStack_b80;
  int iStack_b7c;
  int local_b68;
  int iStack_b64;
  int iStack_b60;
  int iStack_b5c;
  int local_b48;
  int iStack_b44;
  int iStack_b40;
  int iStack_b3c;
  int local_b28;
  int iStack_b24;
  int iStack_b20;
  int iStack_b1c;
  int local_b08;
  int iStack_b04;
  int iStack_b00;
  int iStack_afc;
  int local_ae8;
  int iStack_ae4;
  int iStack_ae0;
  int iStack_adc;
  int local_ac8;
  int iStack_ac4;
  int iStack_ac0;
  int iStack_abc;
  int local_aa8;
  int iStack_aa4;
  int iStack_aa0;
  int iStack_a9c;
  int local_a88;
  int iStack_a84;
  int iStack_a80;
  int iStack_a7c;
  int local_a68;
  int iStack_a64;
  int iStack_a60;
  int iStack_a5c;
  
  piVar117 = cospi_arr(0xc);
  uVar105 = (uint)*(ushort *)(piVar117 + 4) | piVar117[0x3c] << 0x10;
  iVar106 = (uint)*(ushort *)(piVar117 + 0x3c) + piVar117[4] * -0x10000;
  uVar107 = (uint)*(ushort *)(piVar117 + 0x14) | piVar117[0x2c] << 0x10;
  iVar108 = (uint)*(ushort *)(piVar117 + 0x2c) + piVar117[0x14] * -0x10000;
  uVar109 = (uint)*(ushort *)(piVar117 + 0x24) | piVar117[0x1c] << 0x10;
  iVar110 = (uint)*(ushort *)(piVar117 + 0x1c) + piVar117[0x24] * -0x10000;
  uVar111 = (uint)*(ushort *)(piVar117 + 0x34) | piVar117[0xc] << 0x10;
  iVar112 = (uint)*(ushort *)(piVar117 + 0xc) + piVar117[0x34] * -0x10000;
  uVar113 = (uint)*(ushort *)(piVar117 + 0x10) | piVar117[0x30] << 0x10;
  uVar99 = CONCAT44(uVar113,uVar113);
  uVar100 = CONCAT44(uVar113,uVar113);
  iVar114 = (uint)*(ushort *)(piVar117 + 0x30) + piVar117[0x10] * -0x10000;
  uVar113 = -piVar117[0x30] & 0xffffU | piVar117[0x10] << 0x10;
  uVar115 = CONCAT22((short)piVar117[0x20],(short)piVar117[0x20]);
  uVar101 = CONCAT44(uVar115,uVar115);
  uVar102 = CONCAT44(uVar115,uVar115);
  iVar116 = (piVar117[0x20] & 0xffffU) + piVar117[0x20] * -0x10000;
  uVar103 = CONCAT44(iVar116,iVar116);
  uVar104 = CONCAT44(iVar116,iVar116);
  uVar1 = in_RDI[0xe];
  uVar2 = in_RDI[0xf];
  uVar3 = *in_RDI;
  uVar4 = in_RDI[1];
  uVar5 = in_RDI[10];
  uVar6 = in_RDI[0xb];
  uVar7 = in_RDI[4];
  uVar8 = in_RDI[5];
  uVar9 = in_RDI[6];
  uVar10 = in_RDI[7];
  uVar11 = in_RDI[8];
  uVar12 = in_RDI[9];
  uVar13 = in_RDI[2];
  uVar14 = in_RDI[3];
  uVar15 = in_RDI[0xc];
  uVar16 = in_RDI[0xd];
  local_1368 = (undefined2)uVar1;
  uStack_1366 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1364 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1362 = (undefined2)((ulong)uVar1 >> 0x30);
  local_1378 = (undefined2)uVar3;
  uStack_1376 = (undefined2)((ulong)uVar3 >> 0x10);
  uStack_1374 = (undefined2)((ulong)uVar3 >> 0x20);
  uStack_1372 = (undefined2)((ulong)uVar3 >> 0x30);
  uStack_1260 = (undefined2)uVar2;
  uStack_125e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_125c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_125a = (undefined2)((ulong)uVar2 >> 0x30);
  uStack_1270 = (undefined2)uVar4;
  uStack_126e = (undefined2)((ulong)uVar4 >> 0x10);
  uStack_126c = (undefined2)((ulong)uVar4 >> 0x20);
  uStack_126a = (undefined2)((ulong)uVar4 >> 0x30);
  auVar66._2_2_ = local_1378;
  auVar66._0_2_ = local_1368;
  auVar66._4_2_ = uStack_1366;
  auVar66._6_2_ = uStack_1376;
  auVar66._10_2_ = uStack_1374;
  auVar66._8_2_ = uStack_1364;
  auVar66._12_2_ = uStack_1362;
  auVar66._14_2_ = uStack_1372;
  auVar65._8_8_ = CONCAT44(uVar105,uVar105);
  auVar65._0_8_ = CONCAT44(uVar105,uVar105);
  auVar118 = pmaddwd(auVar66,auVar65);
  auVar64._2_2_ = uStack_1270;
  auVar64._0_2_ = uStack_1260;
  auVar64._4_2_ = uStack_125e;
  auVar64._6_2_ = uStack_126e;
  auVar64._10_2_ = uStack_126c;
  auVar64._8_2_ = uStack_125c;
  auVar64._12_2_ = uStack_125a;
  auVar64._14_2_ = uStack_126a;
  auVar63._8_8_ = CONCAT44(uVar105,uVar105);
  auVar63._0_8_ = CONCAT44(uVar105,uVar105);
  auVar119 = pmaddwd(auVar64,auVar63);
  auVar62._2_2_ = local_1378;
  auVar62._0_2_ = local_1368;
  auVar62._4_2_ = uStack_1366;
  auVar62._6_2_ = uStack_1376;
  auVar62._10_2_ = uStack_1374;
  auVar62._8_2_ = uStack_1364;
  auVar62._12_2_ = uStack_1362;
  auVar62._14_2_ = uStack_1372;
  auVar61._8_8_ = CONCAT44(iVar106,iVar106);
  auVar61._0_8_ = CONCAT44(iVar106,iVar106);
  auVar120 = pmaddwd(auVar62,auVar61);
  auVar60._2_2_ = uStack_1270;
  auVar60._0_2_ = uStack_1260;
  auVar60._4_2_ = uStack_125e;
  auVar60._6_2_ = uStack_126e;
  auVar60._10_2_ = uStack_126c;
  auVar60._8_2_ = uStack_125c;
  auVar60._12_2_ = uStack_125a;
  auVar60._14_2_ = uStack_126a;
  auVar59._8_8_ = CONCAT44(iVar106,iVar106);
  auVar59._0_8_ = CONCAT44(iVar106,iVar106);
  auVar121 = pmaddwd(auVar60,auVar59);
  local_a68 = auVar118._0_4_;
  iStack_a64 = auVar118._4_4_;
  iStack_a60 = auVar118._8_4_;
  iStack_a5c = auVar118._12_4_;
  local_a88 = auVar119._0_4_;
  iStack_a84 = auVar119._4_4_;
  iStack_a80 = auVar119._8_4_;
  iStack_a7c = auVar119._12_4_;
  local_aa8 = auVar120._0_4_;
  iStack_aa4 = auVar120._4_4_;
  iStack_aa0 = auVar120._8_4_;
  iStack_a9c = auVar120._12_4_;
  local_ac8 = auVar121._0_4_;
  iStack_ac4 = auVar121._4_4_;
  iStack_ac0 = auVar121._8_4_;
  iStack_abc = auVar121._12_4_;
  auVar118 = ZEXT416(0xc);
  auVar119 = ZEXT416(0xc);
  auVar120 = ZEXT416(0xc);
  auVar121 = ZEXT416(0xc);
  auVar98._4_4_ = iStack_a64 + 0x800 >> auVar118;
  auVar98._0_4_ = local_a68 + 0x800 >> auVar118;
  auVar98._12_4_ = iStack_a5c + 0x800 >> auVar118;
  auVar98._8_4_ = iStack_a60 + 0x800 >> auVar118;
  auVar97._4_4_ = iStack_a84 + 0x800 >> auVar119;
  auVar97._0_4_ = local_a88 + 0x800 >> auVar119;
  auVar97._12_4_ = iStack_a7c + 0x800 >> auVar119;
  auVar97._8_4_ = iStack_a80 + 0x800 >> auVar119;
  auVar118 = packssdw(auVar98,auVar97);
  auVar96._4_4_ = iStack_aa4 + 0x800 >> auVar120;
  auVar96._0_4_ = local_aa8 + 0x800 >> auVar120;
  auVar96._12_4_ = iStack_a9c + 0x800 >> auVar120;
  auVar96._8_4_ = iStack_aa0 + 0x800 >> auVar120;
  auVar95._4_4_ = iStack_ac4 + 0x800 >> auVar121;
  auVar95._0_4_ = local_ac8 + 0x800 >> auVar121;
  auVar95._12_4_ = iStack_abc + 0x800 >> auVar121;
  auVar95._8_4_ = iStack_ac0 + 0x800 >> auVar121;
  auVar119 = packssdw(auVar96,auVar95);
  local_1388 = (undefined2)uVar5;
  uStack_1386 = (undefined2)((ulong)uVar5 >> 0x10);
  uStack_1384 = (undefined2)((ulong)uVar5 >> 0x20);
  uStack_1382 = (undefined2)((ulong)uVar5 >> 0x30);
  local_1398 = (undefined2)uVar7;
  uStack_1396 = (undefined2)((ulong)uVar7 >> 0x10);
  uStack_1394 = (undefined2)((ulong)uVar7 >> 0x20);
  uStack_1392 = (undefined2)((ulong)uVar7 >> 0x30);
  uStack_1280 = (undefined2)uVar6;
  uStack_127e = (undefined2)((ulong)uVar6 >> 0x10);
  uStack_127c = (undefined2)((ulong)uVar6 >> 0x20);
  uStack_127a = (undefined2)((ulong)uVar6 >> 0x30);
  uStack_1290 = (undefined2)uVar8;
  uStack_128e = (undefined2)((ulong)uVar8 >> 0x10);
  uStack_128c = (undefined2)((ulong)uVar8 >> 0x20);
  uStack_128a = (undefined2)((ulong)uVar8 >> 0x30);
  auVar58._2_2_ = local_1398;
  auVar58._0_2_ = local_1388;
  auVar58._4_2_ = uStack_1386;
  auVar58._6_2_ = uStack_1396;
  auVar58._10_2_ = uStack_1394;
  auVar58._8_2_ = uStack_1384;
  auVar58._12_2_ = uStack_1382;
  auVar58._14_2_ = uStack_1392;
  auVar57._8_8_ = CONCAT44(uVar107,uVar107);
  auVar57._0_8_ = CONCAT44(uVar107,uVar107);
  auVar120 = pmaddwd(auVar58,auVar57);
  auVar56._2_2_ = uStack_1290;
  auVar56._0_2_ = uStack_1280;
  auVar56._4_2_ = uStack_127e;
  auVar56._6_2_ = uStack_128e;
  auVar56._10_2_ = uStack_128c;
  auVar56._8_2_ = uStack_127c;
  auVar56._12_2_ = uStack_127a;
  auVar56._14_2_ = uStack_128a;
  auVar55._8_8_ = CONCAT44(uVar107,uVar107);
  auVar55._0_8_ = CONCAT44(uVar107,uVar107);
  auVar121 = pmaddwd(auVar56,auVar55);
  auVar54._2_2_ = local_1398;
  auVar54._0_2_ = local_1388;
  auVar54._4_2_ = uStack_1386;
  auVar54._6_2_ = uStack_1396;
  auVar54._10_2_ = uStack_1394;
  auVar54._8_2_ = uStack_1384;
  auVar54._12_2_ = uStack_1382;
  auVar54._14_2_ = uStack_1392;
  auVar53._8_8_ = CONCAT44(iVar108,iVar108);
  auVar53._0_8_ = CONCAT44(iVar108,iVar108);
  auVar122 = pmaddwd(auVar54,auVar53);
  auVar52._2_2_ = uStack_1290;
  auVar52._0_2_ = uStack_1280;
  auVar52._4_2_ = uStack_127e;
  auVar52._6_2_ = uStack_128e;
  auVar52._10_2_ = uStack_128c;
  auVar52._8_2_ = uStack_127c;
  auVar52._12_2_ = uStack_127a;
  auVar52._14_2_ = uStack_128a;
  auVar51._8_8_ = CONCAT44(iVar108,iVar108);
  auVar51._0_8_ = CONCAT44(iVar108,iVar108);
  auVar123 = pmaddwd(auVar52,auVar51);
  local_ae8 = auVar120._0_4_;
  iStack_ae4 = auVar120._4_4_;
  iStack_ae0 = auVar120._8_4_;
  iStack_adc = auVar120._12_4_;
  local_b08 = auVar121._0_4_;
  iStack_b04 = auVar121._4_4_;
  iStack_b00 = auVar121._8_4_;
  iStack_afc = auVar121._12_4_;
  local_b28 = auVar122._0_4_;
  iStack_b24 = auVar122._4_4_;
  iStack_b20 = auVar122._8_4_;
  iStack_b1c = auVar122._12_4_;
  local_b48 = auVar123._0_4_;
  iStack_b44 = auVar123._4_4_;
  iStack_b40 = auVar123._8_4_;
  iStack_b3c = auVar123._12_4_;
  auVar120 = ZEXT416(0xc);
  auVar121 = ZEXT416(0xc);
  auVar122 = ZEXT416(0xc);
  auVar123 = ZEXT416(0xc);
  auVar94._4_4_ = iStack_ae4 + 0x800 >> auVar120;
  auVar94._0_4_ = local_ae8 + 0x800 >> auVar120;
  auVar94._12_4_ = iStack_adc + 0x800 >> auVar120;
  auVar94._8_4_ = iStack_ae0 + 0x800 >> auVar120;
  auVar93._4_4_ = iStack_b04 + 0x800 >> auVar121;
  auVar93._0_4_ = local_b08 + 0x800 >> auVar121;
  auVar93._12_4_ = iStack_afc + 0x800 >> auVar121;
  auVar93._8_4_ = iStack_b00 + 0x800 >> auVar121;
  auVar120 = packssdw(auVar94,auVar93);
  auVar92._4_4_ = iStack_b24 + 0x800 >> auVar122;
  auVar92._0_4_ = local_b28 + 0x800 >> auVar122;
  auVar92._12_4_ = iStack_b1c + 0x800 >> auVar122;
  auVar92._8_4_ = iStack_b20 + 0x800 >> auVar122;
  auVar91._4_4_ = iStack_b44 + 0x800 >> auVar123;
  auVar91._0_4_ = local_b48 + 0x800 >> auVar123;
  auVar91._12_4_ = iStack_b3c + 0x800 >> auVar123;
  auVar91._8_4_ = iStack_b40 + 0x800 >> auVar123;
  auVar121 = packssdw(auVar92,auVar91);
  local_13a8 = (undefined2)uVar9;
  uStack_13a6 = (undefined2)((ulong)uVar9 >> 0x10);
  uStack_13a4 = (undefined2)((ulong)uVar9 >> 0x20);
  uStack_13a2 = (undefined2)((ulong)uVar9 >> 0x30);
  local_13b8 = (undefined2)uVar11;
  uStack_13b6 = (undefined2)((ulong)uVar11 >> 0x10);
  uStack_13b4 = (undefined2)((ulong)uVar11 >> 0x20);
  uStack_13b2 = (undefined2)((ulong)uVar11 >> 0x30);
  uStack_12a0 = (undefined2)uVar10;
  uStack_129e = (undefined2)((ulong)uVar10 >> 0x10);
  uStack_129c = (undefined2)((ulong)uVar10 >> 0x20);
  uStack_129a = (undefined2)((ulong)uVar10 >> 0x30);
  uStack_12b0 = (undefined2)uVar12;
  uStack_12ae = (undefined2)((ulong)uVar12 >> 0x10);
  uStack_12ac = (undefined2)((ulong)uVar12 >> 0x20);
  uStack_12aa = (undefined2)((ulong)uVar12 >> 0x30);
  auVar50._2_2_ = local_13b8;
  auVar50._0_2_ = local_13a8;
  auVar50._4_2_ = uStack_13a6;
  auVar50._6_2_ = uStack_13b6;
  auVar50._10_2_ = uStack_13b4;
  auVar50._8_2_ = uStack_13a4;
  auVar50._12_2_ = uStack_13a2;
  auVar50._14_2_ = uStack_13b2;
  auVar49._8_8_ = CONCAT44(uVar109,uVar109);
  auVar49._0_8_ = CONCAT44(uVar109,uVar109);
  auVar122 = pmaddwd(auVar50,auVar49);
  auVar48._2_2_ = uStack_12b0;
  auVar48._0_2_ = uStack_12a0;
  auVar48._4_2_ = uStack_129e;
  auVar48._6_2_ = uStack_12ae;
  auVar48._10_2_ = uStack_12ac;
  auVar48._8_2_ = uStack_129c;
  auVar48._12_2_ = uStack_129a;
  auVar48._14_2_ = uStack_12aa;
  auVar47._8_8_ = CONCAT44(uVar109,uVar109);
  auVar47._0_8_ = CONCAT44(uVar109,uVar109);
  auVar123 = pmaddwd(auVar48,auVar47);
  auVar46._2_2_ = local_13b8;
  auVar46._0_2_ = local_13a8;
  auVar46._4_2_ = uStack_13a6;
  auVar46._6_2_ = uStack_13b6;
  auVar46._10_2_ = uStack_13b4;
  auVar46._8_2_ = uStack_13a4;
  auVar46._12_2_ = uStack_13a2;
  auVar46._14_2_ = uStack_13b2;
  auVar45._8_8_ = CONCAT44(iVar110,iVar110);
  auVar45._0_8_ = CONCAT44(iVar110,iVar110);
  auVar124 = pmaddwd(auVar46,auVar45);
  auVar44._2_2_ = uStack_12b0;
  auVar44._0_2_ = uStack_12a0;
  auVar44._4_2_ = uStack_129e;
  auVar44._6_2_ = uStack_12ae;
  auVar44._10_2_ = uStack_12ac;
  auVar44._8_2_ = uStack_129c;
  auVar44._12_2_ = uStack_129a;
  auVar44._14_2_ = uStack_12aa;
  auVar43._8_8_ = CONCAT44(iVar110,iVar110);
  auVar43._0_8_ = CONCAT44(iVar110,iVar110);
  auVar125 = pmaddwd(auVar44,auVar43);
  local_b68 = auVar122._0_4_;
  iStack_b64 = auVar122._4_4_;
  iStack_b60 = auVar122._8_4_;
  iStack_b5c = auVar122._12_4_;
  local_b88 = auVar123._0_4_;
  iStack_b84 = auVar123._4_4_;
  iStack_b80 = auVar123._8_4_;
  iStack_b7c = auVar123._12_4_;
  local_ba8 = auVar124._0_4_;
  iStack_ba4 = auVar124._4_4_;
  iStack_ba0 = auVar124._8_4_;
  iStack_b9c = auVar124._12_4_;
  local_bc8 = auVar125._0_4_;
  iStack_bc4 = auVar125._4_4_;
  iStack_bc0 = auVar125._8_4_;
  iStack_bbc = auVar125._12_4_;
  auVar122 = ZEXT416(0xc);
  auVar123 = ZEXT416(0xc);
  auVar124 = ZEXT416(0xc);
  auVar125 = ZEXT416(0xc);
  auVar90._4_4_ = iStack_b64 + 0x800 >> auVar122;
  auVar90._0_4_ = local_b68 + 0x800 >> auVar122;
  auVar90._12_4_ = iStack_b5c + 0x800 >> auVar122;
  auVar90._8_4_ = iStack_b60 + 0x800 >> auVar122;
  auVar89._4_4_ = iStack_b84 + 0x800 >> auVar123;
  auVar89._0_4_ = local_b88 + 0x800 >> auVar123;
  auVar89._12_4_ = iStack_b7c + 0x800 >> auVar123;
  auVar89._8_4_ = iStack_b80 + 0x800 >> auVar123;
  auVar122 = packssdw(auVar90,auVar89);
  auVar88._4_4_ = iStack_ba4 + 0x800 >> auVar124;
  auVar88._0_4_ = local_ba8 + 0x800 >> auVar124;
  auVar88._12_4_ = iStack_b9c + 0x800 >> auVar124;
  auVar88._8_4_ = iStack_ba0 + 0x800 >> auVar124;
  auVar87._4_4_ = iStack_bc4 + 0x800 >> auVar125;
  auVar87._0_4_ = local_bc8 + 0x800 >> auVar125;
  auVar87._12_4_ = iStack_bbc + 0x800 >> auVar125;
  auVar87._8_4_ = iStack_bc0 + 0x800 >> auVar125;
  auVar123 = packssdw(auVar88,auVar87);
  local_13c8 = (undefined2)uVar13;
  uStack_13c6 = (undefined2)((ulong)uVar13 >> 0x10);
  uStack_13c4 = (undefined2)((ulong)uVar13 >> 0x20);
  uStack_13c2 = (undefined2)((ulong)uVar13 >> 0x30);
  local_13d8 = (undefined2)uVar15;
  uStack_13d6 = (undefined2)((ulong)uVar15 >> 0x10);
  uStack_13d4 = (undefined2)((ulong)uVar15 >> 0x20);
  uStack_13d2 = (undefined2)((ulong)uVar15 >> 0x30);
  uStack_12c0 = (undefined2)uVar14;
  uStack_12be = (undefined2)((ulong)uVar14 >> 0x10);
  uStack_12bc = (undefined2)((ulong)uVar14 >> 0x20);
  uStack_12ba = (undefined2)((ulong)uVar14 >> 0x30);
  uStack_12d0 = (undefined2)uVar16;
  uStack_12ce = (undefined2)((ulong)uVar16 >> 0x10);
  uStack_12cc = (undefined2)((ulong)uVar16 >> 0x20);
  uStack_12ca = (undefined2)((ulong)uVar16 >> 0x30);
  auVar42._2_2_ = local_13d8;
  auVar42._0_2_ = local_13c8;
  auVar42._4_2_ = uStack_13c6;
  auVar42._6_2_ = uStack_13d6;
  auVar42._10_2_ = uStack_13d4;
  auVar42._8_2_ = uStack_13c4;
  auVar42._12_2_ = uStack_13c2;
  auVar42._14_2_ = uStack_13d2;
  auVar41._8_8_ = CONCAT44(uVar111,uVar111);
  auVar41._0_8_ = CONCAT44(uVar111,uVar111);
  auVar124 = pmaddwd(auVar42,auVar41);
  auVar40._2_2_ = uStack_12d0;
  auVar40._0_2_ = uStack_12c0;
  auVar40._4_2_ = uStack_12be;
  auVar40._6_2_ = uStack_12ce;
  auVar40._10_2_ = uStack_12cc;
  auVar40._8_2_ = uStack_12bc;
  auVar40._12_2_ = uStack_12ba;
  auVar40._14_2_ = uStack_12ca;
  auVar39._8_8_ = CONCAT44(uVar111,uVar111);
  auVar39._0_8_ = CONCAT44(uVar111,uVar111);
  auVar125 = pmaddwd(auVar40,auVar39);
  auVar38._2_2_ = local_13d8;
  auVar38._0_2_ = local_13c8;
  auVar38._4_2_ = uStack_13c6;
  auVar38._6_2_ = uStack_13d6;
  auVar38._10_2_ = uStack_13d4;
  auVar38._8_2_ = uStack_13c4;
  auVar38._12_2_ = uStack_13c2;
  auVar38._14_2_ = uStack_13d2;
  auVar37._8_8_ = CONCAT44(iVar112,iVar112);
  auVar37._0_8_ = CONCAT44(iVar112,iVar112);
  auVar126 = pmaddwd(auVar38,auVar37);
  auVar36._2_2_ = uStack_12d0;
  auVar36._0_2_ = uStack_12c0;
  auVar36._4_2_ = uStack_12be;
  auVar36._6_2_ = uStack_12ce;
  auVar36._10_2_ = uStack_12cc;
  auVar36._8_2_ = uStack_12bc;
  auVar36._12_2_ = uStack_12ba;
  auVar36._14_2_ = uStack_12ca;
  auVar35._8_8_ = CONCAT44(iVar112,iVar112);
  auVar35._0_8_ = CONCAT44(iVar112,iVar112);
  auVar127 = pmaddwd(auVar36,auVar35);
  local_be8 = auVar124._0_4_;
  iStack_be4 = auVar124._4_4_;
  iStack_be0 = auVar124._8_4_;
  iStack_bdc = auVar124._12_4_;
  local_c08 = auVar125._0_4_;
  iStack_c04 = auVar125._4_4_;
  iStack_c00 = auVar125._8_4_;
  iStack_bfc = auVar125._12_4_;
  local_c28 = auVar126._0_4_;
  iStack_c24 = auVar126._4_4_;
  iStack_c20 = auVar126._8_4_;
  iStack_c1c = auVar126._12_4_;
  local_c48 = auVar127._0_4_;
  iStack_c44 = auVar127._4_4_;
  iStack_c40 = auVar127._8_4_;
  iStack_c3c = auVar127._12_4_;
  auVar124 = ZEXT416(0xc);
  auVar125 = ZEXT416(0xc);
  auVar126 = ZEXT416(0xc);
  auVar127 = ZEXT416(0xc);
  auVar86._4_4_ = iStack_be4 + 0x800 >> auVar124;
  auVar86._0_4_ = local_be8 + 0x800 >> auVar124;
  auVar86._12_4_ = iStack_bdc + 0x800 >> auVar124;
  auVar86._8_4_ = iStack_be0 + 0x800 >> auVar124;
  auVar85._4_4_ = iStack_c04 + 0x800 >> auVar125;
  auVar85._0_4_ = local_c08 + 0x800 >> auVar125;
  auVar85._12_4_ = iStack_bfc + 0x800 >> auVar125;
  auVar85._8_4_ = iStack_c00 + 0x800 >> auVar125;
  auVar124 = packssdw(auVar86,auVar85);
  auVar84._4_4_ = iStack_c24 + 0x800 >> auVar126;
  auVar84._0_4_ = local_c28 + 0x800 >> auVar126;
  auVar84._12_4_ = iStack_c1c + 0x800 >> auVar126;
  auVar84._8_4_ = iStack_c20 + 0x800 >> auVar126;
  auVar83._4_4_ = iStack_c44 + 0x800 >> auVar127;
  auVar83._0_4_ = local_c48 + 0x800 >> auVar127;
  auVar83._12_4_ = iStack_c3c + 0x800 >> auVar127;
  auVar83._8_4_ = iStack_c40 + 0x800 >> auVar127;
  auVar125 = packssdw(auVar84,auVar83);
  auVar126 = paddsw(auVar118,auVar122);
  auVar118 = psubsw(auVar118,auVar122);
  auVar122 = paddsw(auVar119,auVar123);
  auVar119 = psubsw(auVar119,auVar123);
  auVar123 = paddsw(auVar120,auVar124);
  auVar120 = psubsw(auVar120,auVar124);
  auVar124 = paddsw(auVar121,auVar125);
  auVar121 = psubsw(auVar121,auVar125);
  local_13e8 = auVar118._0_2_;
  uStack_13e6 = auVar118._2_2_;
  uStack_13e4 = auVar118._4_2_;
  uStack_13e2 = auVar118._6_2_;
  local_13f8 = auVar119._0_2_;
  uStack_13f6 = auVar119._2_2_;
  uStack_13f4 = auVar119._4_2_;
  uStack_13f2 = auVar119._6_2_;
  uStack_12e0 = auVar118._8_2_;
  uStack_12de = auVar118._10_2_;
  uStack_12dc = auVar118._12_2_;
  uStack_12da = auVar118._14_2_;
  uStack_12f0 = auVar119._8_2_;
  uStack_12ee = auVar119._10_2_;
  uStack_12ec = auVar119._12_2_;
  uStack_12ea = auVar119._14_2_;
  auVar34._2_2_ = local_13f8;
  auVar34._0_2_ = local_13e8;
  auVar34._4_2_ = uStack_13e6;
  auVar34._6_2_ = uStack_13f6;
  auVar34._10_2_ = uStack_13f4;
  auVar34._8_2_ = uStack_13e4;
  auVar34._12_2_ = uStack_13e2;
  auVar34._14_2_ = uStack_13f2;
  auVar33._8_8_ = uVar100;
  auVar33._0_8_ = uVar99;
  auVar118 = pmaddwd(auVar34,auVar33);
  auVar32._2_2_ = uStack_12f0;
  auVar32._0_2_ = uStack_12e0;
  auVar32._4_2_ = uStack_12de;
  auVar32._6_2_ = uStack_12ee;
  auVar32._10_2_ = uStack_12ec;
  auVar32._8_2_ = uStack_12dc;
  auVar32._12_2_ = uStack_12da;
  auVar32._14_2_ = uStack_12ea;
  auVar31._8_8_ = uVar100;
  auVar31._0_8_ = uVar99;
  auVar119 = pmaddwd(auVar32,auVar31);
  auVar30._2_2_ = local_13f8;
  auVar30._0_2_ = local_13e8;
  auVar30._4_2_ = uStack_13e6;
  auVar30._6_2_ = uStack_13f6;
  auVar30._10_2_ = uStack_13f4;
  auVar30._8_2_ = uStack_13e4;
  auVar30._12_2_ = uStack_13e2;
  auVar30._14_2_ = uStack_13f2;
  auVar29._8_8_ = CONCAT44(iVar114,iVar114);
  auVar29._0_8_ = CONCAT44(iVar114,iVar114);
  auVar125 = pmaddwd(auVar30,auVar29);
  auVar28._2_2_ = uStack_12f0;
  auVar28._0_2_ = uStack_12e0;
  auVar28._4_2_ = uStack_12de;
  auVar28._6_2_ = uStack_12ee;
  auVar28._10_2_ = uStack_12ec;
  auVar28._8_2_ = uStack_12dc;
  auVar28._12_2_ = uStack_12da;
  auVar28._14_2_ = uStack_12ea;
  auVar27._8_8_ = CONCAT44(iVar114,iVar114);
  auVar27._0_8_ = CONCAT44(iVar114,iVar114);
  auVar127 = pmaddwd(auVar28,auVar27);
  local_c68 = auVar118._0_4_;
  iStack_c64 = auVar118._4_4_;
  iStack_c60 = auVar118._8_4_;
  iStack_c5c = auVar118._12_4_;
  local_c88 = auVar119._0_4_;
  iStack_c84 = auVar119._4_4_;
  iStack_c80 = auVar119._8_4_;
  iStack_c7c = auVar119._12_4_;
  local_ca8 = auVar125._0_4_;
  iStack_ca4 = auVar125._4_4_;
  iStack_ca0 = auVar125._8_4_;
  iStack_c9c = auVar125._12_4_;
  local_cc8 = auVar127._0_4_;
  iStack_cc4 = auVar127._4_4_;
  iStack_cc0 = auVar127._8_4_;
  iStack_cbc = auVar127._12_4_;
  auVar118 = ZEXT416(0xc);
  auVar119 = ZEXT416(0xc);
  auVar125 = ZEXT416(0xc);
  auVar127 = ZEXT416(0xc);
  auVar82._4_4_ = iStack_c64 + 0x800 >> auVar118;
  auVar82._0_4_ = local_c68 + 0x800 >> auVar118;
  auVar82._12_4_ = iStack_c5c + 0x800 >> auVar118;
  auVar82._8_4_ = iStack_c60 + 0x800 >> auVar118;
  auVar81._4_4_ = iStack_c84 + 0x800 >> auVar119;
  auVar81._0_4_ = local_c88 + 0x800 >> auVar119;
  auVar81._12_4_ = iStack_c7c + 0x800 >> auVar119;
  auVar81._8_4_ = iStack_c80 + 0x800 >> auVar119;
  auVar118 = packssdw(auVar82,auVar81);
  auVar80._4_4_ = iStack_ca4 + 0x800 >> auVar125;
  auVar80._0_4_ = local_ca8 + 0x800 >> auVar125;
  auVar80._12_4_ = iStack_c9c + 0x800 >> auVar125;
  auVar80._8_4_ = iStack_ca0 + 0x800 >> auVar125;
  auVar79._4_4_ = iStack_cc4 + 0x800 >> auVar127;
  auVar79._0_4_ = local_cc8 + 0x800 >> auVar127;
  auVar79._12_4_ = iStack_cbc + 0x800 >> auVar127;
  auVar79._8_4_ = iStack_cc0 + 0x800 >> auVar127;
  auVar119 = packssdw(auVar80,auVar79);
  local_1408 = auVar120._0_2_;
  uStack_1406 = auVar120._2_2_;
  uStack_1404 = auVar120._4_2_;
  uStack_1402 = auVar120._6_2_;
  local_1418 = auVar121._0_2_;
  uStack_1416 = auVar121._2_2_;
  uStack_1414 = auVar121._4_2_;
  uStack_1412 = auVar121._6_2_;
  uStack_1300 = auVar120._8_2_;
  uStack_12fe = auVar120._10_2_;
  uStack_12fc = auVar120._12_2_;
  uStack_12fa = auVar120._14_2_;
  uStack_1310 = auVar121._8_2_;
  uStack_130e = auVar121._10_2_;
  uStack_130c = auVar121._12_2_;
  uStack_130a = auVar121._14_2_;
  auVar26._2_2_ = local_1418;
  auVar26._0_2_ = local_1408;
  auVar26._4_2_ = uStack_1406;
  auVar26._6_2_ = uStack_1416;
  auVar26._10_2_ = uStack_1414;
  auVar26._8_2_ = uStack_1404;
  auVar26._12_2_ = uStack_1402;
  auVar26._14_2_ = uStack_1412;
  auVar25._8_8_ = CONCAT44(uVar113,uVar113);
  auVar25._0_8_ = CONCAT44(uVar113,uVar113);
  auVar120 = pmaddwd(auVar26,auVar25);
  auVar24._2_2_ = uStack_1310;
  auVar24._0_2_ = uStack_1300;
  auVar24._4_2_ = uStack_12fe;
  auVar24._6_2_ = uStack_130e;
  auVar24._10_2_ = uStack_130c;
  auVar24._8_2_ = uStack_12fc;
  auVar24._12_2_ = uStack_12fa;
  auVar24._14_2_ = uStack_130a;
  auVar23._8_8_ = CONCAT44(uVar113,uVar113);
  auVar23._0_8_ = CONCAT44(uVar113,uVar113);
  auVar121 = pmaddwd(auVar24,auVar23);
  auVar131._2_2_ = local_1418;
  auVar131._0_2_ = local_1408;
  auVar131._4_2_ = uStack_1406;
  auVar131._6_2_ = uStack_1416;
  auVar131._10_2_ = uStack_1414;
  auVar131._8_2_ = uStack_1404;
  auVar131._12_2_ = uStack_1402;
  auVar131._14_2_ = uStack_1412;
  auVar130._8_8_ = uVar100;
  auVar130._0_8_ = uVar99;
  auVar125 = pmaddwd(auVar131,auVar130);
  auVar129._2_2_ = uStack_1310;
  auVar129._0_2_ = uStack_1300;
  auVar129._4_2_ = uStack_12fe;
  auVar129._6_2_ = uStack_130e;
  auVar129._10_2_ = uStack_130c;
  auVar129._8_2_ = uStack_12fc;
  auVar129._12_2_ = uStack_12fa;
  auVar129._14_2_ = uStack_130a;
  auVar128._8_8_ = uVar100;
  auVar128._0_8_ = uVar99;
  auVar127 = pmaddwd(auVar129,auVar128);
  local_ce8 = auVar120._0_4_;
  iStack_ce4 = auVar120._4_4_;
  iStack_ce0 = auVar120._8_4_;
  iStack_cdc = auVar120._12_4_;
  local_d08 = auVar121._0_4_;
  iStack_d04 = auVar121._4_4_;
  iStack_d00 = auVar121._8_4_;
  iStack_cfc = auVar121._12_4_;
  local_d28 = auVar125._0_4_;
  iStack_d24 = auVar125._4_4_;
  iStack_d20 = auVar125._8_4_;
  iStack_d1c = auVar125._12_4_;
  local_d48 = auVar127._0_4_;
  iStack_d44 = auVar127._4_4_;
  iStack_d40 = auVar127._8_4_;
  iStack_d3c = auVar127._12_4_;
  auVar120 = ZEXT416(0xc);
  auVar121 = ZEXT416(0xc);
  auVar125 = ZEXT416(0xc);
  auVar127 = ZEXT416(0xc);
  auVar78._4_4_ = iStack_ce4 + 0x800 >> auVar120;
  auVar78._0_4_ = local_ce8 + 0x800 >> auVar120;
  auVar78._12_4_ = iStack_cdc + 0x800 >> auVar120;
  auVar78._8_4_ = iStack_ce0 + 0x800 >> auVar120;
  auVar77._4_4_ = iStack_d04 + 0x800 >> auVar121;
  auVar77._0_4_ = local_d08 + 0x800 >> auVar121;
  auVar77._12_4_ = iStack_cfc + 0x800 >> auVar121;
  auVar77._8_4_ = iStack_d00 + 0x800 >> auVar121;
  auVar120 = packssdw(auVar78,auVar77);
  auVar76._4_4_ = iStack_d24 + 0x800 >> auVar125;
  auVar76._0_4_ = local_d28 + 0x800 >> auVar125;
  auVar76._12_4_ = iStack_d1c + 0x800 >> auVar125;
  auVar76._8_4_ = iStack_d20 + 0x800 >> auVar125;
  auVar75._4_4_ = iStack_d44 + 0x800 >> auVar127;
  auVar75._0_4_ = local_d48 + 0x800 >> auVar127;
  auVar75._12_4_ = iStack_d3c + 0x800 >> auVar127;
  auVar75._8_4_ = iStack_d40 + 0x800 >> auVar127;
  auVar121 = packssdw(auVar76,auVar75);
  auVar128 = paddsw(auVar126,auVar123);
  auVar123 = psubsw(auVar126,auVar123);
  auVar129 = paddsw(auVar122,auVar124);
  auVar122 = psubsw(auVar122,auVar124);
  auVar130 = paddsw(auVar118,auVar120);
  auVar118 = psubsw(auVar118,auVar120);
  auVar131 = paddsw(auVar119,auVar121);
  auVar119 = psubsw(auVar119,auVar121);
  local_1428 = auVar123._0_2_;
  uStack_1426 = auVar123._2_2_;
  uStack_1424 = auVar123._4_2_;
  uStack_1422 = auVar123._6_2_;
  local_1438 = auVar122._0_2_;
  uStack_1436 = auVar122._2_2_;
  uStack_1434 = auVar122._4_2_;
  uStack_1432 = auVar122._6_2_;
  uStack_1320 = auVar123._8_2_;
  uStack_131e = auVar123._10_2_;
  uStack_131c = auVar123._12_2_;
  uStack_131a = auVar123._14_2_;
  uStack_1330 = auVar122._8_2_;
  uStack_132e = auVar122._10_2_;
  uStack_132c = auVar122._12_2_;
  uStack_132a = auVar122._14_2_;
  auVar22._2_2_ = local_1438;
  auVar22._0_2_ = local_1428;
  auVar22._4_2_ = uStack_1426;
  auVar22._6_2_ = uStack_1436;
  auVar22._10_2_ = uStack_1434;
  auVar22._8_2_ = uStack_1424;
  auVar22._12_2_ = uStack_1422;
  auVar22._14_2_ = uStack_1432;
  auVar21._8_8_ = uVar102;
  auVar21._0_8_ = uVar101;
  auVar120 = pmaddwd(auVar22,auVar21);
  auVar20._2_2_ = uStack_1330;
  auVar20._0_2_ = uStack_1320;
  auVar20._4_2_ = uStack_131e;
  auVar20._6_2_ = uStack_132e;
  auVar20._10_2_ = uStack_132c;
  auVar20._8_2_ = uStack_131c;
  auVar20._12_2_ = uStack_131a;
  auVar20._14_2_ = uStack_132a;
  auVar19._8_8_ = uVar102;
  auVar19._0_8_ = uVar101;
  auVar121 = pmaddwd(auVar20,auVar19);
  auVar18._2_2_ = local_1438;
  auVar18._0_2_ = local_1428;
  auVar18._4_2_ = uStack_1426;
  auVar18._6_2_ = uStack_1436;
  auVar18._10_2_ = uStack_1434;
  auVar18._8_2_ = uStack_1424;
  auVar18._12_2_ = uStack_1422;
  auVar18._14_2_ = uStack_1432;
  auVar17._8_8_ = uVar104;
  auVar17._0_8_ = uVar103;
  auVar122 = pmaddwd(auVar18,auVar17);
  auVar127._2_2_ = uStack_1330;
  auVar127._0_2_ = uStack_1320;
  auVar127._4_2_ = uStack_131e;
  auVar127._6_2_ = uStack_132e;
  auVar127._10_2_ = uStack_132c;
  auVar127._8_2_ = uStack_131c;
  auVar127._12_2_ = uStack_131a;
  auVar127._14_2_ = uStack_132a;
  auVar126._8_8_ = uVar104;
  auVar126._0_8_ = uVar103;
  auVar123 = pmaddwd(auVar127,auVar126);
  local_d68 = auVar120._0_4_;
  iStack_d64 = auVar120._4_4_;
  iStack_d60 = auVar120._8_4_;
  iStack_d5c = auVar120._12_4_;
  local_d88 = auVar121._0_4_;
  iStack_d84 = auVar121._4_4_;
  iStack_d80 = auVar121._8_4_;
  iStack_d7c = auVar121._12_4_;
  local_da8 = auVar122._0_4_;
  iStack_da4 = auVar122._4_4_;
  iStack_da0 = auVar122._8_4_;
  iStack_d9c = auVar122._12_4_;
  local_dc8 = auVar123._0_4_;
  iStack_dc4 = auVar123._4_4_;
  iStack_dc0 = auVar123._8_4_;
  iStack_dbc = auVar123._12_4_;
  auVar120 = ZEXT416(0xc);
  auVar121 = ZEXT416(0xc);
  auVar122 = ZEXT416(0xc);
  auVar123 = ZEXT416(0xc);
  auVar74._4_4_ = iStack_d64 + 0x800 >> auVar120;
  auVar74._0_4_ = local_d68 + 0x800 >> auVar120;
  auVar74._12_4_ = iStack_d5c + 0x800 >> auVar120;
  auVar74._8_4_ = iStack_d60 + 0x800 >> auVar120;
  auVar73._4_4_ = iStack_d84 + 0x800 >> auVar121;
  auVar73._0_4_ = local_d88 + 0x800 >> auVar121;
  auVar73._12_4_ = iStack_d7c + 0x800 >> auVar121;
  auVar73._8_4_ = iStack_d80 + 0x800 >> auVar121;
  auVar126 = packssdw(auVar74,auVar73);
  auVar72._4_4_ = iStack_da4 + 0x800 >> auVar122;
  auVar72._0_4_ = local_da8 + 0x800 >> auVar122;
  auVar72._12_4_ = iStack_d9c + 0x800 >> auVar122;
  auVar72._8_4_ = iStack_da0 + 0x800 >> auVar122;
  auVar71._4_4_ = iStack_dc4 + 0x800 >> auVar123;
  auVar71._0_4_ = local_dc8 + 0x800 >> auVar123;
  auVar71._12_4_ = iStack_dbc + 0x800 >> auVar123;
  auVar71._8_4_ = iStack_dc0 + 0x800 >> auVar123;
  auVar127 = packssdw(auVar72,auVar71);
  local_1448 = auVar118._0_2_;
  uStack_1446 = auVar118._2_2_;
  uStack_1444 = auVar118._4_2_;
  uStack_1442 = auVar118._6_2_;
  local_1458 = auVar119._0_2_;
  uStack_1456 = auVar119._2_2_;
  uStack_1454 = auVar119._4_2_;
  uStack_1452 = auVar119._6_2_;
  uStack_1340 = auVar118._8_2_;
  uStack_133e = auVar118._10_2_;
  uStack_133c = auVar118._12_2_;
  uStack_133a = auVar118._14_2_;
  uStack_1350 = auVar119._8_2_;
  uStack_134e = auVar119._10_2_;
  uStack_134c = auVar119._12_2_;
  uStack_134a = auVar119._14_2_;
  auVar125._2_2_ = local_1458;
  auVar125._0_2_ = local_1448;
  auVar125._4_2_ = uStack_1446;
  auVar125._6_2_ = uStack_1456;
  auVar125._10_2_ = uStack_1454;
  auVar125._8_2_ = uStack_1444;
  auVar125._12_2_ = uStack_1442;
  auVar125._14_2_ = uStack_1452;
  auVar124._8_8_ = uVar102;
  auVar124._0_8_ = uVar101;
  auVar124 = pmaddwd(auVar125,auVar124);
  auVar123._2_2_ = uStack_1350;
  auVar123._0_2_ = uStack_1340;
  auVar123._4_2_ = uStack_133e;
  auVar123._6_2_ = uStack_134e;
  auVar123._10_2_ = uStack_134c;
  auVar123._8_2_ = uStack_133c;
  auVar123._12_2_ = uStack_133a;
  auVar123._14_2_ = uStack_134a;
  auVar122._8_8_ = uVar102;
  auVar122._0_8_ = uVar101;
  auVar122 = pmaddwd(auVar123,auVar122);
  auVar121._2_2_ = local_1458;
  auVar121._0_2_ = local_1448;
  auVar121._4_2_ = uStack_1446;
  auVar121._6_2_ = uStack_1456;
  auVar121._10_2_ = uStack_1454;
  auVar121._8_2_ = uStack_1444;
  auVar121._12_2_ = uStack_1442;
  auVar121._14_2_ = uStack_1452;
  auVar120._8_8_ = uVar104;
  auVar120._0_8_ = uVar103;
  auVar120 = pmaddwd(auVar121,auVar120);
  auVar119._2_2_ = uStack_1350;
  auVar119._0_2_ = uStack_1340;
  auVar119._4_2_ = uStack_133e;
  auVar119._6_2_ = uStack_134e;
  auVar119._10_2_ = uStack_134c;
  auVar119._8_2_ = uStack_133c;
  auVar119._12_2_ = uStack_133a;
  auVar119._14_2_ = uStack_134a;
  auVar118._8_8_ = uVar104;
  auVar118._0_8_ = uVar103;
  auVar118 = pmaddwd(auVar119,auVar118);
  local_de8 = auVar124._0_4_;
  iStack_de4 = auVar124._4_4_;
  iStack_de0 = auVar124._8_4_;
  iStack_ddc = auVar124._12_4_;
  local_e08 = auVar122._0_4_;
  iStack_e04 = auVar122._4_4_;
  iStack_e00 = auVar122._8_4_;
  iStack_dfc = auVar122._12_4_;
  local_e28 = auVar120._0_4_;
  iStack_e24 = auVar120._4_4_;
  iStack_e20 = auVar120._8_4_;
  iStack_e1c = auVar120._12_4_;
  local_e48 = auVar118._0_4_;
  iStack_e44 = auVar118._4_4_;
  iStack_e40 = auVar118._8_4_;
  iStack_e3c = auVar118._12_4_;
  auVar118 = ZEXT416(0xc);
  auVar119 = ZEXT416(0xc);
  auVar120 = ZEXT416(0xc);
  auVar121 = ZEXT416(0xc);
  auVar70._4_4_ = iStack_de4 + 0x800 >> auVar118;
  auVar70._0_4_ = local_de8 + 0x800 >> auVar118;
  auVar70._12_4_ = iStack_ddc + 0x800 >> auVar118;
  auVar70._8_4_ = iStack_de0 + 0x800 >> auVar118;
  auVar69._4_4_ = iStack_e04 + 0x800 >> auVar119;
  auVar69._0_4_ = local_e08 + 0x800 >> auVar119;
  auVar69._12_4_ = iStack_dfc + 0x800 >> auVar119;
  auVar69._8_4_ = iStack_e00 + 0x800 >> auVar119;
  auVar118 = packssdw(auVar70,auVar69);
  auVar68._4_4_ = iStack_e24 + 0x800 >> auVar120;
  auVar68._0_4_ = local_e28 + 0x800 >> auVar120;
  auVar68._12_4_ = iStack_e1c + 0x800 >> auVar120;
  auVar68._8_4_ = iStack_e20 + 0x800 >> auVar120;
  auVar67._4_4_ = iStack_e44 + 0x800 >> auVar121;
  auVar67._0_4_ = local_e48 + 0x800 >> auVar121;
  auVar67._12_4_ = iStack_e3c + 0x800 >> auVar121;
  auVar67._8_4_ = iStack_e40 + 0x800 >> auVar121;
  auVar119 = packssdw(auVar68,auVar67);
  local_1628 = auVar128._0_8_;
  uStack_1620 = auVar128._8_8_;
  *in_RSI = local_1628;
  in_RSI[1] = uStack_1620;
  auVar120 = psubsw(ZEXT816(0),auVar130);
  *(undefined1 (*) [16])(in_RSI + 2) = auVar120;
  local_15c8 = auVar118._0_8_;
  uStack_15c0 = auVar118._8_8_;
  in_RSI[4] = local_15c8;
  in_RSI[5] = uStack_15c0;
  auVar118 = psubsw(ZEXT816(0),auVar126);
  *(undefined1 (*) [16])(in_RSI + 6) = auVar118;
  local_15f8 = auVar127._0_8_;
  uStack_15f0 = auVar127._8_8_;
  in_RSI[8] = local_15f8;
  in_RSI[9] = uStack_15f0;
  auVar118 = psubsw(ZEXT816(0),auVar119);
  *(undefined1 (*) [16])(in_RSI + 10) = auVar118;
  local_15d8 = auVar131._0_8_;
  uStack_15d0 = auVar131._8_8_;
  in_RSI[0xc] = local_15d8;
  in_RSI[0xd] = uStack_15d0;
  auVar118 = psubsw(ZEXT816(0),auVar129);
  *(undefined1 (*) [16])(in_RSI + 0xe) = auVar118;
  return;
}

Assistant:

void av1_iadst8_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __zero = _mm_setzero_si128();
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p04_p60 = pair_set_epi16(cospi[4], cospi[60]);
  const __m128i cospi_p60_m04 = pair_set_epi16(cospi[60], -cospi[4]);
  const __m128i cospi_p20_p44 = pair_set_epi16(cospi[20], cospi[44]);
  const __m128i cospi_p44_m20 = pair_set_epi16(cospi[44], -cospi[20]);
  const __m128i cospi_p36_p28 = pair_set_epi16(cospi[36], cospi[28]);
  const __m128i cospi_p28_m36 = pair_set_epi16(cospi[28], -cospi[36]);
  const __m128i cospi_p52_p12 = pair_set_epi16(cospi[52], cospi[12]);
  const __m128i cospi_p12_m52 = pair_set_epi16(cospi[12], -cospi[52]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_m48_p16 = pair_set_epi16(-cospi[48], cospi[16]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);

  // stage 1
  __m128i x[8];
  x[0] = input[7];
  x[1] = input[0];
  x[2] = input[5];
  x[3] = input[2];
  x[4] = input[3];
  x[5] = input[4];
  x[6] = input[1];
  x[7] = input[6];

  // stage 2
  btf_16_sse2(cospi_p04_p60, cospi_p60_m04, x[0], x[1], x[0], x[1]);
  btf_16_sse2(cospi_p20_p44, cospi_p44_m20, x[2], x[3], x[2], x[3]);
  btf_16_sse2(cospi_p36_p28, cospi_p28_m36, x[4], x[5], x[4], x[5]);
  btf_16_sse2(cospi_p52_p12, cospi_p12_m52, x[6], x[7], x[6], x[7]);

  // stage 3
  btf_16_adds_subs_sse2(x[0], x[4]);
  btf_16_adds_subs_sse2(x[1], x[5]);
  btf_16_adds_subs_sse2(x[2], x[6]);
  btf_16_adds_subs_sse2(x[3], x[7]);

  // stage 4
  btf_16_sse2(cospi_p16_p48, cospi_p48_m16, x[4], x[5], x[4], x[5]);
  btf_16_sse2(cospi_m48_p16, cospi_p16_p48, x[6], x[7], x[6], x[7]);

  // stage 5
  btf_16_adds_subs_sse2(x[0], x[2]);
  btf_16_adds_subs_sse2(x[1], x[3]);
  btf_16_adds_subs_sse2(x[4], x[6]);
  btf_16_adds_subs_sse2(x[5], x[7]);

  // stage 6
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x[2], x[3], x[2], x[3]);
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x[6], x[7], x[6], x[7]);

  // stage 7
  output[0] = x[0];
  output[1] = _mm_subs_epi16(__zero, x[4]);
  output[2] = x[6];
  output[3] = _mm_subs_epi16(__zero, x[2]);
  output[4] = x[3];
  output[5] = _mm_subs_epi16(__zero, x[7]);
  output[6] = x[5];
  output[7] = _mm_subs_epi16(__zero, x[1]);
}